

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diffusion.cpp
# Opt level: O2

void __thiscall
Diffusion::diffuse_velocity
          (Diffusion *this,Real dt,Real be_cn_theta,MultiFab *rho_half,int rho_flag,
          MultiFab *delta_rhs,int rhsComp,MultiFab **betan,MultiFab *betanCC,MultiFab **betanp1,
          MultiFab *betanp1CC,int betaComp)

{
  ostream *poVar1;
  Print *pPVar2;
  double dVar3;
  double dVar4;
  Print local_1b8;
  
  if (verbose != 0) {
    poVar1 = amrex::OutStream();
    amrex::Print::Print(&local_1b8,poVar1);
    std::operator<<((ostream *)&local_1b8.ss,"... Diffusion::diffuse_velocity() lev: ");
    pPVar2 = amrex::Print::operator<<(&local_1b8,&this->level);
    std::endl<char,std::char_traits<char>>((ostream *)&pPVar2->ss);
    amrex::Print::~Print(&local_1b8);
  }
  dVar3 = amrex::ParallelDescriptor::second();
  diffuse_tensor_velocity
            (this,dt,be_cn_theta,rho_half,rho_flag,delta_rhs,rhsComp,betan,betanCC,betanp1,betanp1CC
             ,betaComp);
  if (verbose != 0) {
    dVar4 = amrex::ParallelDescriptor::second();
    poVar1 = amrex::OutStream();
    amrex::Print::Print(&local_1b8,poVar1);
    std::operator<<((ostream *)&local_1b8.ss,"Diffusion::diffuse_velocity(): lev: ");
    pPVar2 = amrex::Print::operator<<(&local_1b8,&this->level);
    std::operator<<((ostream *)&pPVar2->ss,", time: ");
    std::ostream::_M_insert<double>(dVar4 - dVar3);
    std::operator<<((ostream *)&pPVar2->ss,'\n');
    amrex::Print::~Print(&local_1b8);
  }
  return;
}

Assistant:

void
Diffusion::diffuse_velocity (Real                   dt,
                             Real                   be_cn_theta,
                             const MultiFab&        rho_half,
                             int                    rho_flag,
                             MultiFab*              delta_rhs,
                             int                    rhsComp,
                             const MultiFab* const* betan,
                             const MultiFab* const  betanCC,
                             const MultiFab* const* betanp1,
                             const MultiFab* const  betanp1CC,
                             int                    betaComp)
{
  if (verbose) amrex::Print() << "... Diffusion::diffuse_velocity() lev: " << level << std::endl;

    const Real strt_time = ParallelDescriptor::second();

    diffuse_tensor_velocity(dt,be_cn_theta,rho_half,rho_flag,
                            delta_rhs,rhsComp,betan,betanCC,betanp1,betanp1CC,betaComp);

    if (verbose)
    {
        const int IOProc   = ParallelDescriptor::IOProcessorNumber();
        Real      run_time = ParallelDescriptor::second() - strt_time;

        ParallelDescriptor::ReduceRealMax(run_time,IOProc);

        amrex::Print() << "Diffusion::diffuse_velocity(): lev: " << level
                       << ", time: " << run_time << '\n';
    }
}